

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_include_macro(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  size_t sVar1;
  gtoken_s token_00;
  gtoken_t gVar2;
  char *pcVar3;
  gravity_lexer_t **ppgVar4;
  size_t local_e0;
  char *source;
  _Bool is_static;
  size_t sStack_b8;
  uint32_t fileid;
  size_t size;
  gtoken_s local_88;
  gravity_lexer_t *local_60;
  gravity_lexer_t *newlexer;
  char *module_name;
  gtoken_s token;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  while( true ) {
    local_60 = (gravity_lexer_t *)0x0;
    token.value._4_4_ = gravity_lexer_next(lexer_00);
    gravity_lexer_token(&local_88,lexer_00);
    memcpy(&module_name,&local_88,0x28);
    if (token.value._4_4_ != TOK_STRING) {
      pcVar3 = token_name(token.value._4_4_);
      report_error(parser,GRAVITY_ERROR_SYNTAX,0x171498,pcVar3);
      return (gnode_t *)0x0;
    }
    if ((parser->delegate == (gravity_delegate_t *)0x0) ||
       (parser->delegate->loadfile_callback == (gravity_loadfile_callback)0x0)) break;
    token_00.lineno = module_name._4_4_;
    token_00.type = module_name._0_4_;
    token_00.colno = token.type;
    token_00.position = token.lineno;
    token_00.bytes = token.colno;
    token_00.length = token.position;
    token_00.fileid = token.bytes;
    token_00.builtin = token.length;
    token_00.value = (char *)token._24_8_;
    newlexer = (gravity_lexer_t *)cstring_from_token(parser,token_00);
    sStack_b8 = 0;
    source._4_4_ = 0;
    source._3_1_ = 0;
    pcVar3 = (*parser->delegate->loadfile_callback)
                       ((char *)newlexer,&stack0xffffffffffffff48,(uint32_t *)((long)&source + 4),
                        parser->delegate->xdata,(_Bool *)((long)&source + 3));
    if (pcVar3 != (char *)0x0) {
      local_60 = gravity_lexer_create(pcVar3,sStack_b8,source._4_4_,(_Bool)(source._3_1_ & 1));
    }
    if (local_60 == (gravity_lexer_t *)0x0) {
      report_error(parser,GRAVITY_ERROR_SYNTAX,0x171502,(char *)newlexer);
    }
    else {
      if (parser->lexer->n == parser->lexer->m) {
        if (parser->lexer->m == 0) {
          local_e0 = 8;
        }
        else {
          local_e0 = parser->lexer->m << 1;
        }
        parser->lexer->m = local_e0;
        ppgVar4 = (gravity_lexer_t **)realloc(parser->lexer->p,parser->lexer->m << 3);
        parser->lexer->p = ppgVar4;
      }
      ppgVar4 = parser->lexer->p;
      sVar1 = parser->lexer->n;
      parser->lexer->n = sVar1 + 1;
      ppgVar4[sVar1] = local_60;
    }
    if (newlexer != (gravity_lexer_t *)0x0) {
      free(newlexer);
    }
    gVar2 = gravity_lexer_peek(lexer_00);
    if (gVar2 != TOK_OP_COMMA) {
      parse_semicolon(parser);
      return (gnode_t *)0x0;
    }
    gravity_lexer_next(lexer_00);
  }
  gravity_lexer_token((gtoken_s *)&size,lexer_00);
  report_error(parser,GRAVITY_ERROR_SYNTAX,0x1714b9);
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *parse_include_macro (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_include_macro");
    DECLARE_LEXER;

    // process filename (can be an identifier or a literal string)
    // only literals are supported in this version
    gtoken_t type;
    gtoken_s token;
    const char *module_name;
    gravity_lexer_t *newlexer;

loop:
    newlexer = NULL;
    type = gravity_lexer_next(lexer);
    token = gravity_lexer_token(lexer);

    // check if it is a string token
    if (type != TOK_STRING) {
        REPORT_ERROR(token, "Expected file name but found %s.", token_name(type));
        return NULL;
    }

    // check pre-requisites
    if ((!parser->delegate) || (!parser->delegate->loadfile_callback)) {
        REPORT_ERROR(gravity_lexer_token(lexer), "Unable to load file because no loadfile callback registered in delegate.");
        return NULL;
    }

    // parse string
    module_name = cstring_from_token(parser, token);
    size_t size = 0;
    uint32_t fileid = 0;

    // module_name is a filename and it is used by lexer to store filename into tokens
    // tokens are then stored inside AST nodes in order to locate errors into source code
    // AST can live a lot longer than both lexer and parser so we need a way to persistent
    // store these chuncks of memory
    bool is_static = false;
	const char *source = parser->delegate->loadfile_callback(module_name, &size, &fileid, parser->delegate->xdata, &is_static);
	if (source) newlexer = gravity_lexer_create(source, size, fileid, is_static);

    if (newlexer) {
        // push new lexer into lexer stack
        marray_push(gravity_lexer_t*, *parser->lexer, newlexer);
    } else {
        REPORT_ERROR(token, "Unable to load file %s.", module_name);
    }

    // cleanup memory
    if (module_name) mem_free(module_name);

    // check for optional comma
    if (gravity_lexer_peek(lexer) == TOK_OP_COMMA) {
        gravity_lexer_next(lexer); // consume TOK_OP_COMMA
        goto loop;
    }

    // parse semicolon
    parse_semicolon(parser);

    return NULL;
}